

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void printfFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db_00;
  uchar *zFormat_00;
  long in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  int n;
  char *zFormat;
  StrAccum str;
  PrintfArguments x;
  StrAccum *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  u32 uVar1;
  undefined1 local_38 [24];
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  db_00 = sqlite3_context_db_handle(in_RDI);
  if (0 < in_ESI) {
    zFormat_00 = sqlite3_value_text((sqlite3_value *)0x223bca);
    if (zFormat_00 != (uchar *)0x0) {
      local_18 = (undefined1 *)(ulong)(in_ESI - 1);
      local_10 = (undefined1 *)(in_RDX + 8);
      sqlite3StrAccumInit((StrAccum *)local_38,db_00,(char *)0x0,0,db_00->aLimit[0]);
      local_20._0_6_ = CONCAT15('\x02',(undefined5)local_20);
      sqlite3_str_appendf((StrAccum *)local_38,(char *)zFormat_00,&local_18);
      uVar1 = (u32)local_20;
      sqlite3StrAccumFinish(in_stack_ffffffffffffff88);
      sqlite3_result_text((sqlite3_context *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),(char *)db_00
                          ,(int)((ulong)in_RDI >> 0x20),
                          (_func_void_void_ptr *)in_stack_ffffffffffffff88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void printfFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  PrintfArguments x;
  StrAccum str;
  const char *zFormat;
  int n;
  sqlite3 *db = sqlite3_context_db_handle(context);

  if( argc>=1 && (zFormat = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    x.nArg = argc-1;
    x.nUsed = 0;
    x.apArg = argv+1;
    sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
    str.printfFlags = SQLITE_PRINTF_SQLFUNC;
    sqlite3_str_appendf(&str, zFormat, &x);
    n = str.nChar;
    sqlite3_result_text(context, sqlite3StrAccumFinish(&str), n,
                        SQLITE_DYNAMIC);
  }
}